

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tap.cpp
# Opt level: O2

void __thiscall tst_qpromise_tap::rejectedSync_void(tst_qpromise_tap *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  bool bVar3;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<void> *this_01;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_168;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_158;
  QPromiseBase<void> local_150;
  _Any_data local_140;
  undefined **local_130;
  PromiseData<void> *local_128;
  int value;
  QPromiseBase<void> local_118;
  PromiseResolver<void> resolver;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d8;
  QPromise<void> p_1;
  function<void_()> local_b8;
  QArrayDataPointer<char16_t> local_90;
  QPromiseBase<void> local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_40;
  
  value = -1;
  QString::QString((QString *)&local_90,"foo");
  QtPromise::QPromiseBase<void>::reject<QString>(&local_78,(QString *)&local_90);
  p_1.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)local_78.m_d;
  if (local_78.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_78.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa88;
  local_150._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fad0;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fa88;
  local_150.m_d.d = (PromiseData<void> *)this_00;
  local_b8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_b8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_b8);
  QVar2 = p_1.super_QPromiseBase<void>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_168.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_168 = resolver.m_d.d;
  }
  local_158.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130 = (undefined **)&value;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_140._M_unused._0_8_ = resolver.m_d.d;
  local_140._8_8_ = local_168.d;
  local_118._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_68._M_unused._M_object = operator_new(0x18);
  *(void **)local_68._M_unused._0_8_ = local_140._M_unused._M_object;
  if ((Data *)local_140._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_140._M_unused._0_8_ = *local_140._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_140._8_8_;
  if ((Data *)local_140._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_140._8_8_ = *(int *)local_140._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_68._M_unused._0_8_ + 0x10) = local_130;
  pcStack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<void,tst_qpromise_tap::rejectedSync_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_tap::rejectedSync_void()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_140._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  QVar2 = p_1.super_QPromiseBase<void>.m_d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_40,(PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_118,
             (QPromiseResolve<void> *)&local_168,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_158);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_150._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa88;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  local_118.m_d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       p_1.super_QPromiseBase<void>.m_d.d;
  if (p_1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa88;
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fad0;
  this_01 = (PromiseData<void> *)operator_new(0x58);
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_01->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011fa88;
  p.super_QPromiseBase<void>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  QVar2.d = local_150.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_168.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_168 = resolver_1.m_d.d;
  }
  local_158.d = (Data *)0x0;
  if (local_168.d == (Data *)0x0) {
    local_140._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_140._8_8_ = local_168.d;
  }
  local_e0.d = (Data *)0x0;
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_140._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_140._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_140._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = local_118.m_d.d;
  if (local_118.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130 = &PTR__QPromiseBase_0011fa88;
  local_b8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_b8._M_invoker = (_Invoker_type)0x0;
  local_140._M_unused._0_8_ = (undefined8)local_168.d;
  local_d8.d = (Data *)local_140._8_8_;
  local_b8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_b8.super__Function_base._M_functor._M_unused._0_8_ = local_140._M_unused._M_object
  ;
  if ((Data *)local_140._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_140._M_unused._0_8_ = *local_140._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_b8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_140._8_8_;
  if ((Data *)local_140._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_140._8_8_ = *(int *)local_140._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0011fad0;
  *(PromiseData<void> **)((long)local_b8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_128;
  if (local_128 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(local_128->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0011fa88;
  local_b8._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<void>::tap<tst_qpromise_tap::rejectedSync_void()::$_0>(tst_qpromise_tap::rejectedSync_void()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<void>::tap<tst_qpromise_tap::rejectedSync_void()::$_0>(tst_qpromise_tap::rejectedSync_void()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_140._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_b8);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  QVar2.d = local_150.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_140,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_168,
             (QPromiseResolve<void> *)&local_d8,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_140);
  std::_Function_base::~_Function_base((_Function_base *)&local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_158);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa88;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_150.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_150.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_118);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_150);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p_1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  waitForError<QString>((QString *)&local_90,&p,(QString *)&resolver);
  QString::QString((QString *)&p_1,"foo");
  bVar3 = QTest::qCompare((QString *)&local_90,(QString *)&p_1,"waitForError(p, QString{})",
                          "QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                          ,0x90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
  if (bVar3) {
    local_90.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<void,_void_()>::isRejected
                   (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_90,(bool *)&resolver,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                       ,0x91);
    if (bVar3) {
      QTest::qCompare(value,-1,"value","-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tap.cpp"
                      ,0x92);
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_tap::rejectedSync_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::reject(QString{"foo"}).tap([&]() {
        value = 43;
    });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(value, -1);
}